

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_inc_helper_unpolar<ExchCXX::BuiltinSCAN_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double rho_00;
  ulong uVar1;
  double sigma_00;
  double dVar2;
  double tau_00;
  double e;
  double local_38;
  
  if (0 < N) {
    uVar1 = 0;
    do {
      rho_00 = rho[uVar1];
      dVar2 = 0.0;
      if (1e-15 < rho_00) {
        dVar2 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= sigma[uVar1]) {
          dVar2 = sigma[uVar1];
        }
        tau_00 = 1e-20;
        if (1e-20 <= tau[uVar1]) {
          tau_00 = tau[uVar1];
        }
        sigma_00 = rho_00 * 8.0 * tau_00;
        if (dVar2 <= sigma_00) {
          sigma_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinSCAN_X>::eval_exc_unpolar_impl
                  (rho_00,sigma_00,0.0,tau_00,&local_38);
        dVar2 = local_38;
      }
      eps[uVar1] = dVar2 * scal_fact + eps[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double e;
    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], e );
    eps[i] += scal_fact * e;

  }

}